

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDOMWrapAdoptNode(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlDocPtr val_00;
  xmlDocPtr val_01;
  xmlNodePtr val_02;
  uint local_6c;
  int n_options;
  int options;
  int n_destParent;
  xmlNodePtr destParent;
  int n_destDoc;
  xmlDocPtr destDoc;
  xmlNodePtr pxStack_40;
  int n_node;
  xmlNodePtr node;
  int n_sourceDoc;
  xmlDocPtr sourceDoc;
  int n_ctxt;
  xmlDOMWrapCtxtPtr_conflict ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (sourceDoc._4_4_ = 0; (int)sourceDoc._4_4_ < 1; sourceDoc._4_4_ = sourceDoc._4_4_ + 1) {
    for (node._4_4_ = 0; (int)node._4_4_ < 4; node._4_4_ = node._4_4_ + 1) {
      for (destDoc._4_4_ = 0; (int)destDoc._4_4_ < 3; destDoc._4_4_ = destDoc._4_4_ + 1) {
        for (destParent._4_4_ = 0; (int)destParent._4_4_ < 4;
            destParent._4_4_ = destParent._4_4_ + 1) {
          for (n_options = 0; n_options < 3; n_options = n_options + 1) {
            for (local_6c = 0; (int)local_6c < 4; local_6c = local_6c + 1) {
              iVar1 = xmlMemBlocks();
              val_00 = gen_xmlDocPtr(node._4_4_,1);
              pxStack_40 = gen_xmlNodePtr(destDoc._4_4_,2);
              val_01 = gen_xmlDocPtr(destParent._4_4_,3);
              val_02 = gen_xmlNodePtr(n_options,4);
              iVar2 = gen_int(local_6c,5);
              val = xmlDOMWrapAdoptNode(0,val_00,pxStack_40,val_01,val_02,iVar2);
              if ((pxStack_40 != (xmlNodePtr)0x0) && (pxStack_40->parent == (_xmlNode *)0x0)) {
                xmlUnlinkNode(pxStack_40);
                xmlFreeNode(pxStack_40);
                pxStack_40 = (xmlNodePtr)0x0;
              }
              desret_int(val);
              call_tests = call_tests + 1;
              des_xmlDocPtr(node._4_4_,val_00,1);
              des_xmlNodePtr(destDoc._4_4_,pxStack_40,2);
              des_xmlDocPtr(destParent._4_4_,val_01,3);
              des_xmlNodePtr(n_options,val_02,4);
              des_int(local_6c,iVar2,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar2 - iVar1)
                      );
                ret_val = ret_val + 1;
                printf(" %d",(ulong)sourceDoc._4_4_);
                printf(" %d",(ulong)node._4_4_);
                printf(" %d",(ulong)destDoc._4_4_);
                printf(" %d",(ulong)destParent._4_4_);
                printf(" %d",(ulong)(uint)n_options);
                printf(" %d",(ulong)local_6c);
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlDOMWrapAdoptNode(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlDOMWrapCtxtPtr ctxt; /* the optional context for custom processing */
    int n_ctxt;
    xmlDocPtr sourceDoc; /* the optional sourceDoc */
    int n_sourceDoc;
    xmlNodePtr node; /* the node to start with */
    int n_node;
    xmlDocPtr destDoc; /* the destination doc */
    int n_destDoc;
    xmlNodePtr destParent; /* the optional new parent of @node in @destDoc */
    int n_destParent;
    int options; /* option flags */
    int n_options;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlDOMWrapCtxtPtr;n_ctxt++) {
    for (n_sourceDoc = 0;n_sourceDoc < gen_nb_xmlDocPtr;n_sourceDoc++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_destDoc = 0;n_destDoc < gen_nb_xmlDocPtr;n_destDoc++) {
    for (n_destParent = 0;n_destParent < gen_nb_xmlNodePtr;n_destParent++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlDOMWrapCtxtPtr(n_ctxt, 0);
        sourceDoc = gen_xmlDocPtr(n_sourceDoc, 1);
        node = gen_xmlNodePtr(n_node, 2);
        destDoc = gen_xmlDocPtr(n_destDoc, 3);
        destParent = gen_xmlNodePtr(n_destParent, 4);
        options = gen_int(n_options, 5);

        ret_val = xmlDOMWrapAdoptNode(ctxt, sourceDoc, node, destDoc, destParent, options);
        if ((node != NULL) && (node->parent == NULL)) {xmlUnlinkNode(node);xmlFreeNode(node);node = NULL;}
        desret_int(ret_val);
        call_tests++;
        des_xmlDOMWrapCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlDocPtr(n_sourceDoc, sourceDoc, 1);
        des_xmlNodePtr(n_node, node, 2);
        des_xmlDocPtr(n_destDoc, destDoc, 3);
        des_xmlNodePtr(n_destParent, destParent, 4);
        des_int(n_options, options, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_sourceDoc);
            printf(" %d", n_node);
            printf(" %d", n_destDoc);
            printf(" %d", n_destParent);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}